

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int flow_get_outgoing_window(FLOW_HANDLE flow,uint32_t *outgoing_window_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint local_1c;
  
  if (flow == (FLOW_HANDLE)0x0) {
    iVar3 = 0x17e5;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(flow->composite_value,&local_1c);
    iVar3 = 0x17ed;
    if ((iVar1 == 0) && (iVar3 = 0x17f3, 3 < local_1c)) {
      value = amqpvalue_get_composite_item_in_place(flow->composite_value,3);
      iVar3 = 0x17fb;
      if ((value != (AMQP_VALUE)0x0) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)
         ) {
        iVar1 = amqpvalue_get_uint(value,outgoing_window_value);
        iVar3 = 0x1802;
        if (iVar1 == 0) {
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int flow_get_outgoing_window(FLOW_HANDLE flow, uint32_t* outgoing_window_value)
{
    int result;

    if (flow == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow;
        if (amqpvalue_get_composite_item_count(flow_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 3)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(flow_instance->composite_value, 3);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_uint(item_value, outgoing_window_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}